

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O2

size_t fileRead2(void *buf,size_t count,file_t file)

{
  err_t eVar1;
  size_t in_RAX;
  size_t read;
  
  read = in_RAX;
  eVar1 = fileRead(&read,buf,count,file);
  if (eVar1 - 1 < 0xfffffffe) {
    read = 0xffffffffffffffff;
  }
  return read;
}

Assistant:

size_t fileRead2(void* buf, size_t count, file_t file)
{
	err_t code;
	size_t read;
	code = fileRead(&read, buf, count, file);
	if (code != ERR_OK && code != ERR_MAX)
		return SIZE_MAX;
	return read;
}